

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O0

int __thiscall
GmmLib::GmmPageTableMgr::GetPageTableBOList(GmmPageTableMgr *this,uint8_t TTFlags,void *BOList)

{
  HANDLE pvVar1;
  HANDLE *ppvVar2;
  GmmPageTablePool **ppGVar3;
  undefined8 in_RCX;
  uint local_44;
  GmmPageTablePool *pGStack_40;
  int i;
  GMM_PAGETABLEPool *Pool;
  HANDLE *Handles;
  int NumBO;
  void *BOList_local;
  uint8_t TTFlags_local;
  GmmPageTableMgr *this_local;
  
  this_local._4_4_ =
       (*this->_vptr_GmmPageTableMgr[5])
                 (this,(ulong)TTFlags,BOList,CONCAT71((int7)((ulong)in_RCX >> 8),TTFlags));
  if (TTFlags == '\0') {
    this_local._4_4_ = 0;
  }
  else if (BOList == (void *)0x0) {
    this_local._4_4_ = 0;
  }
  else if (this_local._4_4_ == 0) {
    this_local._4_4_ = 0;
  }
  else {
    if (this->AuxTTObj != (AuxTable *)0x0) {
      EnterCriticalSection(&this->PoolLock);
    }
    if ((this->AuxTTObj != (AuxTable *)0x0) &&
       (pvVar1 = PageTable::GetL3Handle(&this->AuxTTObj->super_PageTable), pvVar1 != (HANDLE)0x0)) {
      pvVar1 = PageTable::GetL3Handle(&this->AuxTTObj->super_PageTable);
      *(HANDLE *)BOList = pvVar1;
    }
    pGStack_40 = this->pPool;
    for (local_44 = 0; local_44 < this->NumNodePoolElements; local_44 = local_44 + 1) {
      if (pGStack_40 != (GmmPageTablePool *)0x0) {
        ppvVar2 = GmmPageTablePool::GetPoolHandle(pGStack_40);
        *(HANDLE *)((long)BOList + (long)(int)(local_44 + 1) * 8) = *ppvVar2;
        ppGVar3 = GmmPageTablePool::GetNextPool(pGStack_40);
        pGStack_40 = *ppGVar3;
      }
    }
    if (this->AuxTTObj != (AuxTable *)0x0) {
      LeaveCriticalSection(&this->PoolLock);
    }
  }
  return this_local._4_4_;
}

Assistant:

int GmmLib::GmmPageTableMgr::GetPageTableBOList(uint8_t TTFlags, void *BOList)
{
    int                        NumBO   = GetNumOfPageTableBOs(TTFlags);
    HANDLE *                   Handles = (HANDLE *)BOList;
    GmmLib::GMM_PAGETABLEPool *Pool;

    __GMM_ASSERTPTR(TTFlags & AUXTT, 0);
    __GMM_ASSERTPTR(BOList, 0);
    __GMM_ASSERTPTR(NumBO, 0);

    ENTER_CRITICAL_SECTION

    if(AuxTTObj && AuxTTObj->GetL3Handle())
        Handles[0] = AuxTTObj->GetL3Handle();

    Pool = pPool;

    for(int i = 0; i < NumNodePoolElements; i++)
    {
        if(Pool)
        {
            Handles[i + 1] = Pool->GetPoolHandle();
            Pool           = Pool->GetNextPool();
        }
    }

    EXIT_CRITICAL_SECTION

    return NumBO;
}